

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,REF_DBL *min_bary)

{
  uint uVar1;
  REF_DBL local_78;
  REF_DBL local_70;
  REF_DBL local_68;
  REF_DBL local_60;
  double local_58;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL this_bary;
  REF_NODE pRStack_38;
  REF_INT node;
  REF_NODE to_node;
  REF_MPI ref_mpi;
  REF_GRID to_grid;
  REF_DBL *min_bary_local;
  REF_INTERP ref_interp_local;
  
  ref_mpi = (REF_MPI)ref_interp->to_grid;
  to_node = (REF_NODE)ref_interp->ref_mpi;
  pRStack_38 = ((REF_GRID)ref_mpi)->node;
  *min_bary = 1.0;
  this_bary._4_4_ = 0;
  do {
    to_grid = (REF_GRID)min_bary;
    min_bary_local = (REF_DBL *)ref_interp;
    if (pRStack_38->max <= this_bary._4_4_) {
      _ref_private_macro_code_rss_1 = *min_bary;
      uVar1 = ref_mpi_min((REF_MPI)to_node,&ref_private_macro_code_rss_1,min_bary,3);
      if (uVar1 == 0) {
        ref_interp_local._4_4_ = ref_mpi_bcast((REF_MPI)to_node,to_grid,1,3);
        if (ref_interp_local._4_4_ == 0) {
          ref_interp_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x931,"ref_interp_min_bary",(ulong)ref_interp_local._4_4_,"bcast");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x930,"ref_interp_min_bary",(ulong)uVar1,"min");
        ref_interp_local._4_4_ = uVar1;
      }
      return ref_interp_local._4_4_;
    }
    if ((((-1 < this_bary._4_4_) && (this_bary._4_4_ < pRStack_38->max)) &&
        (-1 < pRStack_38->global[this_bary._4_4_])) &&
       (pRStack_38->ref_mpi->id == pRStack_38->part[this_bary._4_4_])) {
      if (ref_interp->cell[this_bary._4_4_] == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x925,"ref_interp_min_bary","node needs to be localized");
        return 1;
      }
      if (ref_interp->bary[this_bary._4_4_ * 4 + 1] <= ref_interp->bary[this_bary._4_4_ << 2]) {
        local_58 = ref_interp->bary[this_bary._4_4_ * 4 + 1];
      }
      else {
        local_58 = ref_interp->bary[this_bary._4_4_ << 2];
      }
      if (ref_interp->bary[this_bary._4_4_ * 4 + 2] <= local_58) {
        local_68 = ref_interp->bary[this_bary._4_4_ * 4 + 2];
      }
      else {
        if (ref_interp->bary[this_bary._4_4_ * 4 + 1] <= ref_interp->bary[this_bary._4_4_ << 2]) {
          local_60 = ref_interp->bary[this_bary._4_4_ * 4 + 1];
        }
        else {
          local_60 = ref_interp->bary[this_bary._4_4_ << 2];
        }
        local_68 = local_60;
      }
      _ref_private_macro_code_rss_1 = local_68;
      if (((REF_GRID)ref_mpi)->twod == 0) {
        if (ref_interp->bary[this_bary._4_4_ * 4 + 3] <= local_68) {
          local_70 = ref_interp->bary[this_bary._4_4_ * 4 + 3];
        }
        else {
          local_70 = local_68;
        }
        _ref_private_macro_code_rss_1 = local_70;
      }
      if (_ref_private_macro_code_rss_1 <= *min_bary) {
        local_78 = _ref_private_macro_code_rss_1;
      }
      else {
        local_78 = *min_bary;
      }
      *min_bary = local_78;
    }
    this_bary._4_4_ = this_bary._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,
                                       REF_DBL *min_bary) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT node;
  REF_DBL this_bary;

  *min_bary = 1.0;

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");

    this_bary =
        MIN(MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
            ref_interp->bary[2 + 4 * node]);
    if (!ref_grid_twod(to_grid)) {
      this_bary = MIN(this_bary, ref_interp->bary[3 + 4 * node]);
    }
    *min_bary = MIN(*min_bary, this_bary);
  }
  this_bary = *min_bary;
  RSS(ref_mpi_min(ref_mpi, &this_bary, min_bary, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, min_bary, 1, REF_DBL_TYPE), "bcast");

  return REF_SUCCESS;
}